

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv(secp256k1_fe *r,secp256k1_fe *x)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  secp256k1_ge *psVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  secp256k1_ge *r_00;
  ulong uVar46;
  ulong uVar47;
  ulong extraout_RDX;
  long lVar48;
  ulong extraout_RDX_00;
  ulong uVar49;
  ulong uVar50;
  secp256k1_ge *a;
  secp256k1_ge *psVar51;
  secp256k1_ge *a_00;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  byte bVar62;
  secp256k1_fe tmp;
  undefined1 auStack_1a8 [64];
  byte abStack_168 [32];
  byte abStack_148 [32];
  undefined1 auStack_128 [16];
  uint64_t uStack_118;
  uint64_t uStack_110;
  undefined1 auStack_108 [16];
  uint64_t uStack_f8;
  uint64_t uStack_f0;
  secp256k1_fe *psStack_e0;
  ulong uStack_d8;
  ulong uStack_d0;
  secp256k1_fe *psStack_c8;
  secp256k1_modinv64_signed62 *psStack_c0;
  code *pcStack_b8;
  code *pcStack_b0;
  long local_a0;
  ulong local_98;
  secp256k1_modinv64_signed62 local_90;
  secp256k1_fe local_68;
  
  bVar62 = 0;
  pcStack_b0 = (code *)0x14e786;
  secp256k1_fe_verify(x);
  local_a0 = 0x1000003d1;
  uVar39 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar61 = (uVar39 >> 0x34) + x->n[1];
  uVar43 = (uVar61 >> 0x34) + x->n[2];
  uVar44 = (uVar43 >> 0x34) + x->n[3];
  local_98 = (uVar44 >> 0x34) + (x->n[4] & 0xffffffffffff);
  uVar49 = (uVar39 ^ 0x1000003d0) & uVar61 & uVar43 & uVar44 & (local_98 ^ 0xf000000000000);
  pcStack_b0 = (code *)0x14e823;
  secp256k1_fe_verify(x);
  local_68.n[0] = x->n[0];
  local_68.n[1] = x->n[1];
  local_68.n[2] = x->n[2];
  local_68.n[3] = x->n[3];
  local_68.n[4] = x->n[4];
  local_68.magnitude = x->magnitude;
  local_68.normalized = x->normalized;
  pcStack_b0 = (code *)0x14e84c;
  secp256k1_fe_normalize(&local_68);
  local_90.v[0] = (local_68.n[1] << 0x34 | local_68.n[0]) & 0x3fffffffffffffff;
  local_90.v[1] = (ulong)((uint)local_68.n[2] & 0xfffff) << 0x2a | local_68.n[1] >> 10;
  local_90.v[2] = (ulong)((uint)local_68.n[3] & 0x3fffffff) << 0x20 | local_68.n[2] >> 0x14;
  local_90.v[3] = (local_68.n[4] & 0xffffffffff) << 0x16 | local_68.n[3] >> 0x1e;
  local_90.v[4] = local_68.n[4] >> 0x28;
  pcStack_b0 = (code *)0x14e8de;
  secp256k1_modinv64(&local_90,&secp256k1_const_modinfo_fe);
  pcStack_b0 = (code *)0x14e8e9;
  secp256k1_fe_from_signed62(r,&local_90);
  r->magnitude = (uint)(0 < x->magnitude);
  r->normalized = 1;
  pcStack_b0 = (code *)0x14e905;
  secp256k1_fe_verify(r);
  psVar51 = (secp256k1_ge *)(r->n[4] & 0xffffffffffff);
  uVar40 = (r->n[4] >> 0x30) * local_a0 + r->n[0];
  uVar38 = (uVar40 >> 0x34) + r->n[1];
  uVar45 = (uVar38 >> 0x34) + r->n[2];
  uVar50 = (uVar45 >> 0x34) + r->n[3];
  psVar41 = (secp256k1_ge *)((long)(psVar51->x).n + (uVar50 >> 0x34));
  uVar60 = (uVar40 ^ 0x1000003d0) & uVar38 & uVar45 & uVar50 & ((ulong)psVar41 ^ 0xf000000000000);
  uVar39 = (uVar61 | uVar39 | uVar43 | uVar44) & 0xfffffffffffff | local_98;
  if ((uVar49 != 0xfffffffffffff && uVar39 != 0) !=
      (uVar60 == 0xfffffffffffff ||
      ((uVar38 | uVar40 | uVar45 | uVar50) & 0xfffffffffffff) == 0 && psVar41 == (secp256k1_ge *)0x0
      )) {
    secp256k1_fe_verify(r);
    return;
  }
  pcStack_b0 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_1();
  uVar38 = (psVar41->x).n[0];
  if (uVar38 >> 0x3e == 0) {
    uVar40 = (psVar41->x).n[1];
    if (0x3fffffffffffffff < uVar40) goto LAB_0014ea8c;
    uVar43 = (psVar41->x).n[2];
    if (0x3fffffffffffffff < uVar43) goto LAB_0014ea91;
    uVar44 = (psVar41->x).n[3];
    if (0x3fffffffffffffff < uVar44) goto LAB_0014ea96;
    uVar45 = (psVar41->x).n[4];
    if (uVar45 < 0x100) {
      (psVar51->x).n[0] = uVar38 & 0xfffffffffffff;
      (psVar51->x).n[1] = (uVar40 & 0x3ffffffffff) << 10 | uVar38 >> 0x34;
      (psVar51->x).n[2] = (uVar43 & 0xffffffff) << 0x14 | uVar40 >> 0x2a;
      (psVar51->x).n[3] = (ulong)((uint)uVar44 & 0x3fffff) << 0x1e | uVar43 >> 0x20;
      (psVar51->x).n[4] = uVar45 << 0x28 | uVar44 >> 0x16;
      return;
    }
  }
  else {
    pcStack_b8 = (code *)0x14ea8c;
    secp256k1_fe_from_signed62_cold_5();
LAB_0014ea8c:
    pcStack_b8 = (code *)0x14ea91;
    secp256k1_fe_from_signed62_cold_4();
LAB_0014ea91:
    pcStack_b8 = (code *)0x14ea96;
    secp256k1_fe_from_signed62_cold_3();
LAB_0014ea96:
    pcStack_b8 = (code *)0x14ea9b;
    secp256k1_fe_from_signed62_cold_2();
  }
  pcStack_b8 = secp256k1_scalar_split_lambda;
  secp256k1_fe_from_signed62_cold_1();
  a = psVar41;
  a_00 = r_00;
  psStack_e0 = r;
  uStack_d8 = uVar60;
  uStack_d0 = uVar39;
  psStack_c8 = x;
  psStack_c0 = &local_90;
  pcStack_b8 = (code *)uVar49;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if (psVar51 == r_00) {
    secp256k1_scalar_split_lambda_cold_6();
LAB_0014f023:
    secp256k1_scalar_split_lambda_cold_5();
LAB_0014f028:
    secp256k1_scalar_split_lambda_cold_4();
LAB_0014f02d:
    secp256k1_scalar_split_lambda_cold_3();
  }
  else {
    if (psVar41 == r_00) goto LAB_0014f023;
    if (psVar51 == psVar41) goto LAB_0014f028;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g1);
    uVar38 = (r_00->x).n[0];
    uVar39 = (r_00->x).n[1];
    uVar40 = (r_00->x).n[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar38;
    uVar45 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar45;
    auStack_1a8._0_8_ = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar38;
    auVar4 = auVar4 * ZEXT816(0x3daa8a1471e8ca7f);
    uVar44 = SUB168(auVar4 + auVar36,0);
    uVar50 = SUB168(auVar4 + auVar36,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar39;
    uVar49 = SUB168(auVar5 * ZEXT816(0xe893209a45dbb031),8);
    uVar43 = SUB168(auVar5 * ZEXT816(0xe893209a45dbb031),0);
    auStack_1a8._8_8_ = uVar44 + uVar43;
    uVar43 = (ulong)CARRY8(uVar44,uVar43);
    uVar44 = uVar50 + uVar49;
    uVar60 = uVar44 + uVar43;
    uVar56 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar45,auVar4._0_8_)) +
             (ulong)(CARRY8(uVar50,uVar49) || CARRY8(uVar44,uVar43));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar38;
    uVar61 = SUB168(auVar6 * ZEXT816(0xe86c90e49284eb15),8);
    uVar43 = SUB168(auVar6 * ZEXT816(0xe86c90e49284eb15),0);
    uVar45 = uVar60 + uVar43;
    uVar43 = (ulong)CARRY8(uVar60,uVar43);
    uVar49 = uVar56 + uVar61;
    uVar57 = uVar49 + uVar43;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar39;
    uVar46 = SUB168(auVar7 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar44 = SUB168(auVar7 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar60 = uVar45 + uVar44;
    uVar44 = (ulong)CARRY8(uVar45,uVar44);
    uVar50 = uVar57 + uVar46;
    uVar58 = uVar50 + uVar44;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar40;
    uVar47 = SUB168(auVar8 * ZEXT816(0xe893209a45dbb031),8);
    uVar45 = SUB168(auVar8 * ZEXT816(0xe893209a45dbb031),0);
    auStack_1a8._16_8_ = uVar60 + uVar45;
    uVar45 = (ulong)CARRY8(uVar60,uVar45);
    uVar60 = uVar58 + uVar47;
    uVar59 = uVar60 + uVar45;
    uVar52 = (ulong)(CARRY8(uVar56,uVar61) || CARRY8(uVar49,uVar43)) +
             (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar50,uVar44)) +
             (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar60,uVar45));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar38;
    uVar47 = SUB168(auVar9 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar38 = SUB168(auVar9 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar45 = uVar59 + uVar38;
    uVar43 = (ulong)CARRY8(uVar59,uVar38);
    uVar50 = uVar52 + uVar47;
    uVar59 = uVar50 + uVar43;
    uVar38 = (r_00->x).n[3];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar39;
    uVar56 = SUB168(auVar10 * ZEXT816(0xe86c90e49284eb15),8);
    uVar44 = SUB168(auVar10 * ZEXT816(0xe86c90e49284eb15),0);
    uVar49 = uVar45 + uVar44;
    uVar44 = (ulong)CARRY8(uVar45,uVar44);
    uVar60 = uVar59 + uVar56;
    uVar53 = uVar60 + uVar44;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar40;
    uVar57 = SUB168(auVar11 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar45 = SUB168(auVar11 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar46 = uVar49 + uVar45;
    uVar45 = (ulong)CARRY8(uVar49,uVar45);
    uVar61 = uVar53 + uVar57;
    uVar54 = uVar61 + uVar45;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar38;
    uVar58 = SUB168(auVar12 * ZEXT816(0xe893209a45dbb031),8);
    uVar49 = SUB168(auVar12 * ZEXT816(0xe893209a45dbb031),0);
    auStack_1a8._24_8_ = uVar46 + uVar49;
    uVar49 = (ulong)CARRY8(uVar46,uVar49);
    uVar46 = uVar54 + uVar58;
    uVar55 = uVar46 + uVar49;
    uVar47 = (ulong)(CARRY8(uVar52,uVar47) || CARRY8(uVar50,uVar43)) +
             (ulong)(CARRY8(uVar59,uVar56) || CARRY8(uVar60,uVar44)) +
             (ulong)(CARRY8(uVar53,uVar57) || CARRY8(uVar61,uVar45)) +
             (ulong)(CARRY8(uVar54,uVar58) || CARRY8(uVar46,uVar49));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar39;
    uVar60 = SUB168(auVar13 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar39 = SUB168(auVar13 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar44 = uVar55 + uVar39;
    uVar39 = (ulong)CARRY8(uVar55,uVar39);
    uVar45 = uVar47 + uVar60;
    uVar56 = uVar45 + uVar39;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar40;
    uVar61 = SUB168(auVar14 * ZEXT816(0xe86c90e49284eb15),8);
    uVar43 = SUB168(auVar14 * ZEXT816(0xe86c90e49284eb15),0);
    uVar50 = uVar44 + uVar43;
    uVar43 = (ulong)CARRY8(uVar44,uVar43);
    uVar49 = uVar56 + uVar61;
    uVar57 = uVar49 + uVar43;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar38;
    uVar46 = SUB168(auVar15 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar44 = SUB168(auVar15 * ZEXT816(0x3daa8a1471e8ca7f),0);
    auStack_1a8._32_8_ = uVar50 + uVar44;
    uVar44 = (ulong)CARRY8(uVar50,uVar44);
    uVar50 = uVar57 + uVar46;
    uVar58 = uVar50 + uVar44;
    uVar50 = (ulong)(CARRY8(uVar47,uVar60) || CARRY8(uVar45,uVar39)) +
             (ulong)(CARRY8(uVar56,uVar61) || CARRY8(uVar49,uVar43)) +
             (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar50,uVar44));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar40;
    uVar45 = SUB168(auVar16 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar39 = SUB168(auVar16 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar44 = uVar58 + uVar39;
    uVar39 = (ulong)CARRY8(uVar58,uVar39);
    uVar43 = uVar50 + uVar45;
    uVar60 = uVar43 + uVar39;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar38;
    uVar49 = SUB168(auVar17 * ZEXT816(0xe86c90e49284eb15),8);
    uVar40 = SUB168(auVar17 * ZEXT816(0xe86c90e49284eb15),0);
    auStack_1a8._40_8_ = uVar44 + uVar40;
    uVar40 = (ulong)CARRY8(uVar44,uVar40);
    uVar44 = uVar60 + uVar49;
    auStack_1a8._56_8_ =
         (ulong)(CARRY8(uVar50,uVar45) || CARRY8(uVar43,uVar39)) +
         (ulong)(CARRY8(uVar60,uVar49) || CARRY8(uVar44,uVar40));
    auStack_1a8._48_8_ = uVar44 + uVar40;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar38;
    auStack_1a8._48_16_ = auVar18 * ZEXT816(0x3086d221a7d46bcd) + auStack_1a8._48_16_;
    uStack_118 = 0;
    uStack_110 = 0;
    auStack_128 = auStack_1a8._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_128,0,(uint)((ulong)auStack_1a8._40_8_ >> 0x3f));
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_128);
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g2);
    uVar38 = (r_00->x).n[0];
    uVar39 = (r_00->x).n[1];
    uVar40 = (r_00->x).n[2];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar38;
    uVar45 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),8);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar45;
    auStack_1a8._0_8_ = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),0);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar38;
    auVar20 = auVar20 * ZEXT816(0x221208ac9df506c6);
    uVar44 = SUB168(auVar20 + auVar37,0);
    uVar50 = SUB168(auVar20 + auVar37,8);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar39;
    uVar49 = SUB168(auVar21 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar43 = SUB168(auVar21 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_1a8._8_8_ = uVar44 + uVar43;
    uVar43 = (ulong)CARRY8(uVar44,uVar43);
    uVar44 = uVar50 + uVar49;
    uVar60 = uVar44 + uVar43;
    uVar56 = (ulong)CARRY8(auVar20._8_8_,(ulong)CARRY8(uVar45,auVar20._0_8_)) +
             (ulong)(CARRY8(uVar50,uVar49) || CARRY8(uVar44,uVar43));
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar38;
    uVar61 = SUB168(auVar22 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar43 = SUB168(auVar22 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar45 = uVar60 + uVar43;
    uVar43 = (ulong)CARRY8(uVar60,uVar43);
    uVar49 = uVar56 + uVar61;
    uVar57 = uVar49 + uVar43;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar39;
    uVar46 = SUB168(auVar23 * ZEXT816(0x221208ac9df506c6),8);
    uVar44 = SUB168(auVar23 * ZEXT816(0x221208ac9df506c6),0);
    uVar60 = uVar45 + uVar44;
    uVar44 = (ulong)CARRY8(uVar45,uVar44);
    uVar50 = uVar57 + uVar46;
    uVar58 = uVar50 + uVar44;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar40;
    uVar47 = SUB168(auVar24 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar45 = SUB168(auVar24 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_1a8._16_8_ = uVar60 + uVar45;
    uVar45 = (ulong)CARRY8(uVar60,uVar45);
    uVar60 = uVar58 + uVar47;
    uVar59 = uVar60 + uVar45;
    uVar52 = (ulong)(CARRY8(uVar56,uVar61) || CARRY8(uVar49,uVar43)) +
             (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar50,uVar44)) +
             (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar60,uVar45));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar38;
    uVar47 = SUB168(auVar25 * ZEXT816(0xe4437ed6010e8828),8);
    uVar38 = SUB168(auVar25 * ZEXT816(0xe4437ed6010e8828),0);
    uVar45 = uVar59 + uVar38;
    uVar43 = (ulong)CARRY8(uVar59,uVar38);
    uVar50 = uVar52 + uVar47;
    uVar59 = uVar50 + uVar43;
    uVar38 = (r_00->x).n[3];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar39;
    uVar56 = SUB168(auVar26 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar44 = SUB168(auVar26 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar49 = uVar45 + uVar44;
    uVar44 = (ulong)CARRY8(uVar45,uVar44);
    uVar60 = uVar59 + uVar56;
    uVar53 = uVar60 + uVar44;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar40;
    uVar57 = SUB168(auVar27 * ZEXT816(0x221208ac9df506c6),8);
    uVar45 = SUB168(auVar27 * ZEXT816(0x221208ac9df506c6),0);
    uVar46 = uVar49 + uVar45;
    uVar45 = (ulong)CARRY8(uVar49,uVar45);
    uVar61 = uVar53 + uVar57;
    uVar54 = uVar61 + uVar45;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar38;
    uVar58 = SUB168(auVar28 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar49 = SUB168(auVar28 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_1a8._24_8_ = uVar46 + uVar49;
    uVar49 = (ulong)CARRY8(uVar46,uVar49);
    uVar46 = uVar54 + uVar58;
    uVar55 = uVar46 + uVar49;
    uVar47 = (ulong)(CARRY8(uVar52,uVar47) || CARRY8(uVar50,uVar43)) +
             (ulong)(CARRY8(uVar59,uVar56) || CARRY8(uVar60,uVar44)) +
             (ulong)(CARRY8(uVar53,uVar57) || CARRY8(uVar61,uVar45)) +
             (ulong)(CARRY8(uVar54,uVar58) || CARRY8(uVar46,uVar49));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar39;
    uVar60 = SUB168(auVar29 * ZEXT816(0xe4437ed6010e8828),8);
    uVar39 = SUB168(auVar29 * ZEXT816(0xe4437ed6010e8828),0);
    uVar44 = uVar55 + uVar39;
    uVar39 = (ulong)CARRY8(uVar55,uVar39);
    uVar45 = uVar47 + uVar60;
    uVar56 = uVar45 + uVar39;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar40;
    uVar61 = SUB168(auVar30 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar43 = SUB168(auVar30 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar50 = uVar44 + uVar43;
    uVar43 = (ulong)CARRY8(uVar44,uVar43);
    uVar49 = uVar56 + uVar61;
    uVar57 = uVar49 + uVar43;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar38;
    uVar46 = SUB168(auVar31 * ZEXT816(0x221208ac9df506c6),8);
    uVar44 = SUB168(auVar31 * ZEXT816(0x221208ac9df506c6),0);
    auStack_1a8._32_8_ = uVar50 + uVar44;
    uVar44 = (ulong)CARRY8(uVar50,uVar44);
    uVar50 = uVar57 + uVar46;
    uVar58 = uVar50 + uVar44;
    uVar50 = (ulong)(CARRY8(uVar47,uVar60) || CARRY8(uVar45,uVar39)) +
             (ulong)(CARRY8(uVar56,uVar61) || CARRY8(uVar49,uVar43)) +
             (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar50,uVar44));
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar40;
    uVar45 = SUB168(auVar32 * ZEXT816(0xe4437ed6010e8828),8);
    uVar39 = SUB168(auVar32 * ZEXT816(0xe4437ed6010e8828),0);
    uVar44 = uVar58 + uVar39;
    uVar39 = (ulong)CARRY8(uVar58,uVar39);
    uVar43 = uVar50 + uVar45;
    uVar60 = uVar43 + uVar39;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar38;
    uVar49 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar40 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c4),0);
    auStack_1a8._40_8_ = uVar44 + uVar40;
    uVar40 = (ulong)CARRY8(uVar44,uVar40);
    uVar44 = uVar60 + uVar49;
    auVar35._8_8_ =
         (ulong)(CARRY8(uVar50,uVar45) || CARRY8(uVar43,uVar39)) +
         (ulong)(CARRY8(uVar60,uVar49) || CARRY8(uVar44,uVar40));
    auVar35._0_8_ = uVar44 + uVar40;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar38;
    auStack_1a8._48_16_ = auVar34 * ZEXT816(0xe4437ed6010e8828) + auVar35;
    uStack_f8 = 0;
    uStack_f0 = 0;
    auStack_108 = auStack_1a8._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_108,0,(uint)((ulong)auStack_1a8._40_8_ >> 0x3f));
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_108);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_128,(secp256k1_scalar *)auStack_128,
               &secp256k1_scalar_split_lambda::minus_b1);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_108,(secp256k1_scalar *)auStack_108,
               &secp256k1_scalar_split_lambda::minus_b2);
    secp256k1_scalar_add
              ((secp256k1_scalar *)psVar41,(secp256k1_scalar *)auStack_128,
               (secp256k1_scalar *)auStack_108);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)psVar51,(secp256k1_scalar *)psVar41,&secp256k1_const_lambda);
    secp256k1_scalar_negate((secp256k1_scalar *)psVar51,(secp256k1_scalar *)psVar51);
    secp256k1_scalar_add
              ((secp256k1_scalar *)psVar51,(secp256k1_scalar *)psVar51,(secp256k1_scalar *)r_00);
    secp256k1_scalar_verify((secp256k1_scalar *)psVar51);
    secp256k1_scalar_verify((secp256k1_scalar *)psVar41);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_1a8,&secp256k1_const_lambda,(secp256k1_scalar *)psVar41);
    a = (secp256k1_ge *)auStack_1a8;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_1a8,(secp256k1_scalar *)auStack_1a8,
               (secp256k1_scalar *)psVar51);
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_1a8);
    a_00 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if ((((auStack_1a8._0_8_ != (r_00->x).n[0]) || (auStack_1a8._8_8_ != (r_00->x).n[1])) ||
        (auStack_1a8._16_8_ != (r_00->x).n[2])) || (auStack_1a8._24_8_ != (r_00->x).n[3]))
    goto LAB_0014f02d;
    secp256k1_scalar_negate((secp256k1_scalar *)auStack_1a8,(secp256k1_scalar *)psVar51);
    secp256k1_scalar_get_b32(abStack_148,(secp256k1_scalar *)psVar51);
    secp256k1_scalar_get_b32(abStack_168,(secp256k1_scalar *)auStack_1a8);
    psVar51 = (secp256k1_ge *)0x0;
    uVar38 = extraout_RDX;
    do {
      uVar39 = uVar38 & 0xffffffff;
      bVar1 = abStack_148[(long)psVar51];
      bVar2 = (byte)psVar51[0x3f8d].x.n[1];
      uVar38 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar38 = uVar39;
      }
      iVar42 = (int)uVar38;
      if (bVar1 != bVar2) goto LAB_0014ef55;
      psVar51 = (secp256k1_ge *)((long)(psVar51->x).n + 1);
    } while (psVar51 != (secp256k1_ge *)0x20);
    iVar42 = 0;
LAB_0014ef55:
    if (iVar42 < 0) {
LAB_0014ef87:
      secp256k1_scalar_negate((secp256k1_scalar *)auStack_1a8,(secp256k1_scalar *)psVar41);
      secp256k1_scalar_get_b32(abStack_148,(secp256k1_scalar *)psVar41);
      secp256k1_scalar_get_b32(abStack_168,(secp256k1_scalar *)auStack_1a8);
      psVar41 = (secp256k1_ge *)0x0;
      uVar38 = extraout_RDX_00;
      do {
        uVar39 = uVar38 & 0xffffffff;
        bVar1 = abStack_148[(long)psVar41];
        bVar2 = (byte)psVar41[0x3f8d].x.magnitude;
        uVar38 = (ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          uVar38 = uVar39;
        }
        iVar42 = (int)uVar38;
        if (bVar1 != bVar2) goto LAB_0014efde;
        psVar41 = (secp256k1_ge *)((long)(psVar41->x).n + 1);
      } while (psVar41 != (secp256k1_ge *)0x20);
      iVar42 = 0;
LAB_0014efde:
      if (iVar42 < 0) {
        return;
      }
      lVar48 = 0;
      do {
        a = (secp256k1_ge *)((ulong)psVar41 & 0xffffffff);
        bVar1 = abStack_168[lVar48];
        a_00 = (secp256k1_ge *)(ulong)bVar1;
        bVar2 = (&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar48];
        psVar41 = (secp256k1_ge *)(ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          psVar41 = a;
        }
        iVar42 = (int)psVar41;
        if (bVar1 != bVar2) goto LAB_0014f008;
        lVar48 = lVar48 + 1;
      } while (lVar48 != 0x20);
      iVar42 = 0;
LAB_0014f008:
      if (iVar42 < 0) {
        return;
      }
      goto LAB_0014f037;
    }
    lVar48 = 0;
    do {
      a = (secp256k1_ge *)((ulong)psVar51 & 0xffffffff);
      bVar1 = abStack_168[lVar48];
      a_00 = (secp256k1_ge *)(ulong)bVar1;
      bVar2 = (&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar48];
      psVar51 = (secp256k1_ge *)(ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        psVar51 = a;
      }
      iVar42 = (int)psVar51;
      if (bVar1 != bVar2) goto LAB_0014ef7f;
      lVar48 = lVar48 + 1;
    } while (lVar48 != 0x20);
    iVar42 = 0;
LAB_0014ef7f:
    if (iVar42 < 0) goto LAB_0014ef87;
  }
  secp256k1_scalar_split_lambda_cold_1();
LAB_0014f037:
  secp256k1_scalar_split_lambda_cold_2();
  secp256k1_ge_verify(a);
  psVar41 = a_00;
  for (lVar48 = 0xd; lVar48 != 0; lVar48 = lVar48 + -1) {
    (psVar41->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((long)a + (ulong)bVar62 * -0x10 + 8);
    psVar41 = (secp256k1_ge *)((long)psVar41 + (ulong)bVar62 * -0x10 + 8);
  }
  secp256k1_fe_mul(&a_00->x,&a_00->x,&secp256k1_const_beta);
  secp256k1_ge_verify(a_00);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}